

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O0

bool __thiscall
dg::pta::PointerIdPointsToSet::add<std::initializer_list<dg::pta::Pointer>>
          (PointerIdPointsToSet *this,initializer_list<dg::pta::Pointer> *C)

{
  bool bVar1;
  const_iterator pPVar2;
  initializer_list<dg::pta::Pointer> *in_RSI;
  initializer_list<dg::pta::Pointer> *in_RDI;
  Pointer *ptr;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<dg::pta::Pointer> *__range3;
  bool changed;
  const_iterator local_28;
  undefined7 in_stack_ffffffffffffffe8;
  byte bVar3;
  
  bVar3 = 0;
  local_28 = std::initializer_list<dg::pta::Pointer>::begin(in_RSI);
  pPVar2 = std::initializer_list<dg::pta::Pointer>::end(in_RDI);
  for (; local_28 != pPVar2; local_28 = local_28 + 1) {
    bVar1 = add((PointerIdPointsToSet *)CONCAT17(bVar3,in_stack_ffffffffffffffe8),(Pointer *)in_RSI)
    ;
    bVar3 = (bVar3 & 1) != 0 || bVar1;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool add(const ContainerTy &C) {
        bool changed = false;
        for (const auto &ptr : C)
            changed |= add(ptr);
        return changed;
    }